

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O2

int32_t tnt_schema_stosid(tnt_schema *schema_obj,char *name,uint32_t name_len)

{
  mh_assoc_t *h;
  mh_int_t mVar1;
  int32_t iVar2;
  undefined4 in_register_00000014;
  undefined1 local_20 [8];
  assoc_key space_key;
  
  h = schema_obj->space_hash;
  local_20 = (undefined1  [8])name;
  space_key.id._0_4_ = name_len;
  mVar1 = mh_assoc_find(h,(assoc_key *)local_20,(void *)CONCAT44(in_register_00000014,name_len));
  if (mVar1 == h->n_buckets) {
    iVar2 = -1;
  }
  else {
    iVar2 = *(int32_t *)((long)h->p[mVar1]->data + 0xc);
  }
  return iVar2;
}

Assistant:

int32_t tnt_schema_stosid(struct tnt_schema *schema_obj, const char *name,
			  uint32_t name_len) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	struct assoc_key space_key = {name, name_len};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	const struct tnt_schema_sval *space =
		(*mh_assoc_node(schema, space_slot))->data;
	return space->number;
}